

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase161::run(TestCase161 *this)

{
  undefined1 in_CL;
  EncodingResult<kj::Array<char32_t>_> local_360;
  EncodingResult<kj::Array<char32_t>_> local_340;
  EncodingResult<kj::Array<char32_t>_> local_320;
  EncodingResult<kj::Array<char32_t>_> local_300;
  EncodingResult<kj::Array<char32_t>_> local_2e0;
  EncodingResult<kj::Array<char32_t>_> local_2c0;
  EncodingResult<kj::Array<char32_t>_> local_2a0;
  EncodingResult<kj::Array<char32_t>_> local_280;
  EncodingResult<kj::Array<char32_t>_> local_260;
  EncodingResult<kj::Array<char32_t>_> local_240;
  EncodingResult<kj::Array<char32_t>_> local_220;
  EncodingResult<kj::Array<char32_t>_> local_200;
  EncodingResult<kj::Array<char32_t>_> local_1e0;
  EncodingResult<kj::Array<char32_t>_> local_1c0;
  EncodingResult<kj::Array<char32_t>_> local_1a0;
  EncodingResult<kj::Array<char32_t>_> local_180;
  EncodingResult<kj::Array<char32_t>_> local_160;
  EncodingResult<kj::Array<char32_t>_> local_140;
  EncodingResult<kj::Array<char32_t>_> local_120;
  EncodingResult<kj::Array<char32_t>_> local_100;
  EncodingResult<kj::Array<char32_t>_> local_e0;
  EncodingResult<kj::Array<char32_t>_> local_c0;
  EncodingResult<kj::Array<char32_t>_> local_a0;
  EncodingResult<kj::Array<char32_t>_> local_80;
  EncodingResult<kj::Array<char32_t>_> local_60;
  EncodingResult<kj::Array<char32_t>_> local_30;
  TestCase161 *local_10;
  TestCase161 *this_local;
  
  local_10 = this;
  encodeUtf32<2ul>(&local_30,(kj *)(anon_var_dwarf_24a91d + 7),(char (*) [2])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_30,&anon_var_dwarf_24aa3d,true);
  EncodingResult<kj::Array<char32_t>_>::~EncodingResult(&local_30);
  encodeUtf32<4ul>(&local_60,(kj *)anon_var_dwarf_24a78d,(char (*) [4])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,4ul>
            (&local_60,&anon_var_dwarf_24aa53,true);
  EncodingResult<kj::Array<char32_t>_>::~EncodingResult(&local_60);
  encodeUtf32<6ul>(&local_80,(kj *)anon_var_dwarf_24a7ad,(char (*) [6])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,4ul>
            (&local_80,&anon_var_dwarf_24aa53,true);
  EncodingResult<kj::Array<char32_t>_>::~EncodingResult(&local_80);
  encodeUtf32<3ul>(&local_a0,(kj *)anon_var_dwarf_24a7b7,(char (*) [3])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,3ul>
            (&local_a0,&anon_var_dwarf_24aa5d,true);
  EncodingResult<kj::Array<char32_t>_>::~EncodingResult(&local_a0);
  encodeUtf32<3ul>(&local_c0,(kj *)anon_var_dwarf_24a7e3,(char (*) [3])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,3ul>
            (&local_c0,&anon_var_dwarf_24aa5d,true);
  EncodingResult<kj::Array<char32_t>_>::~EncodingResult(&local_c0);
  encodeUtf32<4ul>(&local_e0,(kj *)anon_var_dwarf_24a7ed,(char (*) [4])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,3ul>
            (&local_e0,&anon_var_dwarf_24aa5d,true);
  EncodingResult<kj::Array<char32_t>_>::~EncodingResult(&local_e0);
  encodeUtf32<3ul>(&local_100,(kj *)anon_var_dwarf_24a7f7,(char (*) [3])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,3ul>
            (&local_100,&anon_var_dwarf_24aa5d,true);
  EncodingResult<kj::Array<char32_t>_>::~EncodingResult(&local_100);
  encodeUtf32<4ul>(&local_120,(kj *)anon_var_dwarf_24a801,(char (*) [4])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,3ul>
            (&local_120,&anon_var_dwarf_24aa5d,true);
  EncodingResult<kj::Array<char32_t>_>::~EncodingResult(&local_120);
  encodeUtf32<5ul>(&local_140,(kj *)anon_var_dwarf_24a80b,(char (*) [5])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,3ul>
            (&local_140,&anon_var_dwarf_24aa5d,true);
  EncodingResult<kj::Array<char32_t>_>::~EncodingResult(&local_140);
  encodeUtf32<3ul>(&local_160,(kj *)anon_var_dwarf_24a815,(char (*) [3])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_160,&anon_var_dwarf_24aa3d,true);
  EncodingResult<kj::Array<char32_t>_>::~EncodingResult(&local_160);
  encodeUtf32<3ul>(&local_180,(kj *)anon_var_dwarf_24a81f,(char (*) [3])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_180,&anon_var_dwarf_24aa3d,true);
  EncodingResult<kj::Array<char32_t>_>::~EncodingResult(&local_180);
  encodeUtf32<3ul>(&local_1a0,(kj *)anon_var_dwarf_24a829,(char (*) [3])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_1a0,(char32_t (*) [2])L"\x80",false);
  EncodingResult<kj::Array<char32_t>_>::~EncodingResult(&local_1a0);
  encodeUtf32<3ul>(&local_1c0,(kj *)anon_var_dwarf_24a83d,(char (*) [3])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_1c0,(char32_t (*) [2])L"߿",false);
  EncodingResult<kj::Array<char32_t>_>::~EncodingResult(&local_1c0);
  encodeUtf32<4ul>(&local_1e0,(kj *)anon_var_dwarf_24a851,(char (*) [4])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_1e0,&anon_var_dwarf_24aa3d,true);
  EncodingResult<kj::Array<char32_t>_>::~EncodingResult(&local_1e0);
  encodeUtf32<4ul>(&local_200,(kj *)anon_var_dwarf_24a85b,(char (*) [4])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_200,&anon_var_dwarf_24aa3d,true);
  EncodingResult<kj::Array<char32_t>_>::~EncodingResult(&local_200);
  encodeUtf32<4ul>(&local_220,(kj *)anon_var_dwarf_24a865,(char (*) [4])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_220,(char32_t (*) [2])L"ࠀ",false);
  EncodingResult<kj::Array<char32_t>_>::~EncodingResult(&local_220);
  encodeUtf32<4ul>(&local_240,(kj *)anon_var_dwarf_24a88d,(char (*) [4])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_240,(char32_t (*) [2])L"\xffff",false);
  EncodingResult<kj::Array<char32_t>_>::~EncodingResult(&local_240);
  encodeUtf32<5ul>(&local_260,(kj *)anon_var_dwarf_24a8a1,(char (*) [5])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_260,&anon_var_dwarf_24aa3d,true);
  EncodingResult<kj::Array<char32_t>_>::~EncodingResult(&local_260);
  encodeUtf32<5ul>(&local_280,(kj *)anon_var_dwarf_24a8ab,(char (*) [5])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_280,&anon_var_dwarf_24aa3d,true);
  EncodingResult<kj::Array<char32_t>_>::~EncodingResult(&local_280);
  encodeUtf32<5ul>(&local_2a0,(kj *)anon_var_dwarf_24a8b5,(char (*) [5])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_2a0,(char32_t (*) [2])L"𐀀",false);
  EncodingResult<kj::Array<char32_t>_>::~EncodingResult(&local_2a0);
  encodeUtf32<5ul>(&local_2c0,(kj *)anon_var_dwarf_24a8c9,(char (*) [5])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_2c0,(char32_t (*) [2])L"\x0010ffff",false);
  EncodingResult<kj::Array<char32_t>_>::~EncodingResult(&local_2c0);
  encodeUtf32<5ul>(&local_2e0,(kj *)anon_var_dwarf_24a8dd,(char (*) [5])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_2e0,&anon_var_dwarf_24aa3d,true);
  EncodingResult<kj::Array<char32_t>_>::~EncodingResult(&local_2e0);
  encodeUtf32<6ul>(&local_300,(kj *)anon_var_dwarf_24a8e7,(char (*) [6])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_300,&anon_var_dwarf_24aa3d,true);
  EncodingResult<kj::Array<char32_t>_>::~EncodingResult(&local_300);
  encodeUtf32<7ul>(&local_320,(kj *)anon_var_dwarf_24a8f1,(char (*) [7])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_320,&anon_var_dwarf_24aa3d,true);
  EncodingResult<kj::Array<char32_t>_>::~EncodingResult(&local_320);
  encodeUtf32<8ul>(&local_340,(kj *)anon_var_dwarf_24a907,(char (*) [8])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_340,&anon_var_dwarf_24aa3d,true);
  EncodingResult<kj::Array<char32_t>_>::~EncodingResult(&local_340);
  encodeUtf32<9ul>(&local_360,(kj *)anon_var_dwarf_24a91d,(char (*) [9])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char32_t>,char32_t,2ul>
            (&local_360,&anon_var_dwarf_24aa3d,true);
  EncodingResult<kj::Array<char32_t>_>::~EncodingResult(&local_360);
  return;
}

Assistant:

TEST(AsyncUnixTest, SignalWithValue) {
  // This tests that if we use sigqueue() to attach a value to the signal, that value is received
  // correctly.  Note that this only works on platforms that support real-time signals -- even
  // though the signal we're sending is SIGURG, the sigqueue() system call is introduced by RT
  // signals.  Hence this test won't run on e.g. Mac OSX.
  //
  // Also, Android's bionic does not appear to support sigqueue() even though the kernel does.
  //
  // Also, this test fails on Linux on mipsel. si_value comes back as zero. No one with a mips
  // machine wants to debug the problem but they demand a patch fixing it, so we disable the test.
  // Sad. https://github.com/capnproto/capnproto/issues/204

  if (BROKEN_QEMU) return;

  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  union sigval value;
  memset(&value, 0, sizeof(value));
  value.sival_int = 123;
  KJ_SYSCALL_HANDLE_ERRORS(sigqueue(getpid(), SIGURG, value)) {
    case ENOSYS:
      // sigqueue() not supported. Maybe running on WSL.
      KJ_LOG(WARNING, "sigqueue() is not implemented by your system; skipping test");
      return;
    default:
      KJ_FAIL_SYSCALL("sigqueue(getpid(), SIGURG, value)", error);
  }

  siginfo_t info = port.onSignal(SIGURG).wait(waitScope);
  EXPECT_EQ(SIGURG, info.si_signo);
  EXPECT_SI_CODE(SI_QUEUE, info.si_code);
  EXPECT_EQ(123, info.si_value.sival_int);
}